

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PSocket.cpp
# Opt level: O0

int __thiscall P2PSocket::listen(P2PSocket *this,int __fd,int __n)

{
  bool bVar1;
  uint uVar2;
  P2PSocketException *this_00;
  int *piVar3;
  char *__rhs;
  undefined7 extraout_var;
  socklen_t *in_RCX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  sockaddr *extraout_RDX_01;
  ulong uVar4;
  int local_84;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  int local_18;
  int i;
  int remain;
  int queue_local;
  P2PSocket *this_local;
  
  uVar4 = (ulong)(uint)__fd;
  i = __fd;
  _remain = this;
  SocketResource::setNonBlockingMode(&this->m_socket);
  if (i < 1) {
    local_84 = this->m_maxPeers;
    uVar2 = Peers::count(&this->m_peers);
    in_RCX = (socklen_t *)(ulong)uVar2;
    local_84 = local_84 - uVar2;
    __addr = extraout_RDX_00;
  }
  else {
    local_84 = i;
    __addr = extraout_RDX;
  }
  local_18 = local_84;
  if (0 < local_84) {
    for (local_1c = 0; local_1c <= local_18; local_1c = local_1c + 1) {
      uVar2 = Peers::accept(&this->m_peers,(int)uVar4,__addr,in_RCX);
      if ((uVar2 & 1) == 0) {
        this_00 = (P2PSocketException *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,"Accept failure ",&local_61);
        piVar3 = __errno_location();
        __rhs = strerror(*piVar3);
        std::operator+(&local_40,&local_60,__rhs);
        P2PSocketException::P2PSocketException(this_00,&local_40);
        __cxa_throw(this_00,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
      }
      __addr = extraout_RDX_01;
    }
  }
  bVar1 = SocketResource::setBlockMode(&this->m_socket);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void P2PSocket::listen(int queue)
{
    m_socket.setNonBlockingMode();
    int remain = queue > 0 ? queue : m_maxPeers - m_peers.count();
    if (remain > 0) {
        for (int i = 0; i <= remain; ++i) {
            if (!m_peers.accept())
                throw P2PSocketException(std::string{"Accept failure "} + std::strerror(errno));
        }
    }
    m_socket.setBlockMode();
}